

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall
DataFilters::addNumericFilter
          (DataFilters *this,uint *index,double *minValue,double *maxValue,bool *isAccept)

{
  uint index_00;
  NumericFilter filter;
  NumericFilter local_68;
  NumericFilterCase local_50;
  bool *local_30;
  bool *isAccept_local;
  double *maxValue_local;
  double *minValue_local;
  uint *index_local;
  DataFilters *this_local;
  
  index_00 = *index;
  local_30 = isAccept;
  isAccept_local = (bool *)maxValue;
  maxValue_local = minValue;
  minValue_local = (double *)index;
  index_local = (uint *)this;
  NumericFilter::NumericFilter(&local_68,minValue,maxValue,isAccept);
  filter._minValue = local_68._minValue;
  filter._maxValue = local_68._maxValue;
  filter._isAccept = local_68._isAccept;
  filter._17_7_ = local_68._17_7_;
  NumericFilterCase::NumericFilterCase(&local_50,index_00,filter);
  std::vector<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>::
  push_back(&this->_numericFilters,&local_50);
  return;
}

Assistant:

void
    addNumericFilter(unsigned int const & index,
                     double const & minValue,
                     double const & maxValue,
                     bool const & isAccept)
    {
        this->_numericFilters.push_back(NumericFilterCase(index, NumericFilter(minValue, maxValue, isAccept)));
    }